

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O1

void __thiscall
(anonymous_namespace)::IntrusiveListIteratorTest::
TestForward<std::reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>>
          (IntrusiveListIteratorTest *this,
          reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
          *first,reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
                 *last,vector<int,_std::allocator<int>_> *expected)

{
  intrusive_list<(anonymous_namespace)::TestObject> *piVar1;
  bool bVar2;
  pointer pTVar3;
  char *pcVar4;
  long lVar5;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  internal local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  unsigned_long local_40;
  AssertHelper local_38;
  
  local_40 = 0;
  if (*(intrusive_list<(anonymous_namespace)::TestObject> **)this == (first->current).list_) {
    do {
      if (*(TestObject **)(this + 8) == (first->current).node_) {
        local_58.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)(last->current).node_ - (long)(last->current).list_ >> 2);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  (local_50,"count","expected.size()",&local_40,(unsigned_long *)&local_58);
        if (local_50[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_58);
          if (local_48.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((local_48.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-intrusive-list.cc"
                     ,0xa6,pcVar4);
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
          testing::internal::AssertHelper::~AssertHelper(&local_38);
          if (local_58.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_58.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_58.ptr_ + 8))();
            }
            local_58.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
LAB_001e50ee:
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        return;
      }
      lVar5 = local_40 * 4;
      piVar1 = (last->current).list_;
      pTVar3 = std::
               reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
               ::operator->((reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
                             *)this);
      testing::internal::CmpHelperEQ<int,int>
                (local_50,"expected[count]","first->data",(int *)((long)&piVar1->first_ + lVar5),
                 &pTVar3->data);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_58);
        if (local_48.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((local_48.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-intrusive-list.cc"
                   ,0xa2,pcVar4);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if (local_58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_58.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_58.ptr_ + 8))();
          }
          local_58.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        goto LAB_001e50ee;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar5 = *(long *)(this + 8);
      if (lVar5 == 0) {
        lVar5 = *(long *)this;
      }
      *(undefined8 *)(this + 8) = *(undefined8 *)(lVar5 + 8);
      local_40 = local_40 + 1;
    } while (*(intrusive_list<(anonymous_namespace)::TestObject> **)this == (first->current).list_);
  }
  __assert_fail("list_ == rhs.list_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                ,0xfe,
                "bool wabt::intrusive_list<(anonymous namespace)::TestObject>::const_iterator::operator==(const_iterator) const [T = (anonymous namespace)::TestObject]"
               );
}

Assistant:

void TestForward(Iter first, Iter last, const std::vector<int>& expected) {
    size_t count = 0;
    while (first != last) {
      ASSERT_EQ(expected[count], first->data);
      ++first;
      ++count;
    }
    ASSERT_EQ(count, expected.size());
  }